

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool duckdb::DictionaryCompression::HasEnoughSpace
               (idx_t current_count,idx_t index_count,idx_t dict_size,
               bitpacking_width_t packing_width,idx_t block_size)

{
  unsigned_long uVar1;
  
  if ((current_count & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)current_count & 0x1f);
    current_count = (current_count - uVar1) + 0x20;
  }
  return dict_size + index_count * 4 + (packing_width * current_count >> 3) + 0x14 <= block_size;
}

Assistant:

bool DictionaryCompression::HasEnoughSpace(idx_t current_count, idx_t index_count, idx_t dict_size,
                                           bitpacking_width_t packing_width, const idx_t block_size) {
	return RequiredSpace(current_count, index_count, dict_size, packing_width) <= block_size;
}